

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::keyToIdx<std::__cxx11::string_const&>
          (Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,size_t *idx,
          InfoType *info)

{
  size_t sVar1;
  
  sVar1 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)this,key);
  *info = (((uint)sVar1 & 0x1f) >> ((byte)this[0x2c] & 0x3f)) + *(int *)(this + 0x28);
  *idx = sVar1 >> 5 & *(ulong *)(this + 0x18);
  return;
}

Assistant:

void keyToIdx(HashKey&& key, size_t* idx, InfoType* info) const {
        // for a user-specified hash that is *not* robin_hood::hash, apply robin_hood::hash as
        // an additional mixing step. This serves as a bad hash prevention, if the given data is
        // badly mixed.
        using Mix =
            typename std::conditional<std::is_same<::robin_hood::hash<key_type>, hasher>::value,
                                      ::robin_hood::detail::identity_hash<size_t>,
                                      ::robin_hood::hash<size_t>>::type;

        // the lower InitialInfoNumBits are reserved for info.
        auto h = Mix{}(WHash::operator()(key));
        *info = mInfoInc + static_cast<InfoType>((h & InfoMask) >> mInfoHashShift);
        *idx = (h >> InitialInfoNumBits) & mMask;
    }